

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

string * __thiscall
Quest_Context::SerializeProgress_abi_cxx11_(string *__return_storage_ptr__,Quest_Context *this)

{
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
  _Var1;
  _Base_ptr p_Var2;
  int subject;
  _Rb_tree_header *__x;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",(allocator<char> *)&local_50);
  __x = &(this->progress)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (this->progress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != __x; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    util::to_string_abi_cxx11_
              (&local_50,(util *)(ulong)(uint)(int)(short)p_Var2[2]._M_color,subject);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    _Var1 = std::prev<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,short>>>
                      ((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>
                        )__x,1);
    if (p_Var2 != _Var1._M_node) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Quest_Context::SerializeProgress() const
{
	std::string serialized = "{";

	UTIL_CIFOREACH(this->progress, it)
	{
		serialized += it->first;
		serialized += "=";
		serialized += util::to_string(it->second);

		if (it != std::prev(this->progress.cend()))
		{
			serialized += ",";
		}
	}

	serialized += "}";

	return serialized;
}